

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O1

ErrorNumber
doRangeTestFixSize(RangeTestFunction testFunction,void *opaqueData,TA_Integer refOutBeg,
                  TA_Integer refOutNbElement,TA_Integer refLookback,TA_Real *refBuffer,
                  TA_Integer *refBufferInt,TA_FuncUnstId unstId,TA_Integer fixSize,uint outputNb,
                  uint integerTolerance)

{
  TA_RetCode TVar1;
  int iVar2;
  uint uVar3;
  double *__ptr;
  double *__ptr_00;
  long lVar4;
  ulong uVar5;
  ErrorNumber EVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  undefined4 in_register_00000084;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  TA_Integer outputNbElement;
  uint local_f4;
  TA_Integer outputBegIdx;
  uint local_ec;
  double local_e8;
  double local_e0;
  double local_d8;
  ulong local_d0;
  uint local_c4;
  TA_Integer lookback;
  uint outputIsInteger;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  uint local_8c;
  uint local_88;
  int local_84;
  int local_80;
  TA_FuncUnstId local_7c;
  long local_78;
  ulong local_70;
  void *local_68;
  TA_Integer *local_60;
  TA_Real *local_58;
  RangeTestFunction local_50;
  long local_48;
  ulong local_40;
  TA_Real *local_38;
  
  local_48 = CONCAT44(in_register_00000084,refLookback);
  uVar13 = (ulong)unstId;
  local_f4 = refOutBeg;
  local_50 = testFunction;
  local_38 = refBuffer;
  __ptr = (double *)malloc(uVar13 * 8 + 0x10);
  if (__ptr == (double *)0x0) {
    return TA_TESTUTIL_DRT_ALLOC_ERR;
  }
  __ptr_00 = (double *)malloc((uVar13 + 2) * 4);
  *__ptr = 9.1349043e-200;
  local_78 = (long)unstId;
  __ptr[local_78 + 1] = 8.1489031e-158;
  *(undefined4 *)__ptr_00 = 0x80000000;
  *(undefined4 *)((long)__ptr_00 + local_78 * 4 + 4) = 0x80000000;
  if (TA_FUNC_UNST_ADX < unstId) {
    uVar5 = 1;
    do {
      __ptr[uVar5] = -2.849284e-199;
      *(undefined4 *)((long)__ptr_00 + uVar5 * 4) = 0x80000000;
      uVar5 = uVar5 + 1;
    } while ((uint)(unstId + TA_FUNC_UNST_ADXR) != uVar5);
  }
  local_7c = refOutNbElement;
  if (unstId < refOutNbElement) {
    local_7c = unstId;
  }
  local_ec = refOutNbElement;
  if (unstId + 0xffffff04 == 0 || unstId < 0xfc) {
    local_78 = local_78 + 1;
    local_80 = -(unstId + 0xffffff04);
    local_58 = __ptr + 1;
    local_60 = (TA_Integer *)((long)__ptr_00 + 4);
    local_d8 = *(double *)
                (&DAT_001888e0 + (ulong)((TA_FuncUnstId)refBufferInt == TA_FUNC_UNST_T3) * 8);
    local_8c = outputNb * 2;
    local_88 = outputNb * 3;
    uVar8 = unstId + TA_FUNC_UNST_ADXR;
    local_40 = (ulong)uVar8 + 2 & 0xfffffffffffffffc;
    lVar4 = (ulong)uVar8 - 2;
    local_a8._8_4_ = (int)lVar4;
    local_a8._0_8_ = lVar4;
    local_a8._12_4_ = (int)((ulong)lVar4 >> 0x20);
    local_70 = (ulong)(uVar8 & 0xfffffffe);
    uVar8 = 0;
    local_d0 = uVar13;
    local_68 = opaqueData;
    do {
      uVar7 = (unstId + uVar8) - 1;
      TVar1 = CallTestFunction(local_50,uVar8,uVar7,local_58,local_60,&outputBegIdx,&outputNbElement
                               ,&lookback,opaqueData,fixSize,&outputIsInteger);
      iVar11 = local_80;
      if (TVar1 != TA_SUCCESS) {
        printf("Fail: doRangeTestFixSize testFunction return error=(%d) (%d,%d)\n",(ulong)TVar1,
               (ulong)(uint)unstId,(ulong)uVar8);
        free(__ptr);
        EVar6 = TA_TESTUTIL_DRT_RETCODE_ERR;
        goto LAB_0011dc68;
      }
      if (outputNbElement != 0) {
        iVar11 = outputBegIdx - local_f4;
        if (((outputBegIdx < (int)local_f4) || (outputBegIdx < (int)uVar8)) ||
           (local_84 = (int)local_d0 + uVar8, local_84 <= outputBegIdx)) {
          puts("Fail: doRangeTestFixSize bad outBegIdx");
          printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)uVar7,
                 (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_d0);
          printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f4,
                 (ulong)local_ec);
          free(__ptr);
          EVar6 = TA_TESTUTIL_DRT_BAD_OUTBEGIDX;
          goto LAB_0011dc68;
        }
        if (local_7c < outputNbElement) {
          puts("Fail: doRangeTestFixSize Incorrect outputNbElement");
          printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)uVar7,
                 (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_d0);
          printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f4,
                 (ulong)local_ec);
          EVar6 = TA_TESTUTIL_DRT_BAD_OUTNBLEMENT;
          __ptr_00 = __ptr;
          goto LAB_0011dc68;
        }
        if (outputBegIdx < lookback) {
          printf("Fail: doRangeTestFixSize Lookback calculation too high? (%d)\n");
          printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)uVar7,
                 (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_d0);
          printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f4,
                 (ulong)local_ec);
          free(__ptr);
          EVar6 = TA_TESTUTIL_DRT_LOOKBACK_TOO_HIGH;
          goto LAB_0011dc68;
        }
        local_c4 = uVar7;
        if (outputNbElement < 1) goto LAB_0011d608;
        uVar7 = 0;
        goto LAB_0011d0f8;
      }
      if ((lookback < (int)uVar8) || (lookback < (int)uVar7)) {
        printf("Fail: doRangeTestFixSize data missing (%d,%d,%d)\n",(ulong)uVar8,(ulong)uVar7);
        free(__ptr);
        EVar6 = TA_TESTUTIL_DRT_MISSING_DATA;
        goto LAB_0011dc68;
      }
      uVar7 = uVar8;
      if ((int)(uVar8 + 100) <= local_80 && 0x1e < (int)uVar8) {
        iVar2 = rand();
        uVar7 = uVar8 + iVar2 % 100 + 0x28;
      }
      uVar8 = uVar7 + 1;
    } while ((int)uVar7 < iVar11);
  }
  free(__ptr);
  EVar6 = TA_TEST_PASS;
  goto LAB_0011dc68;
  while( true ) {
    if ((0x1e < outputNbElement) &&
       (uVar12 = outputNbElement - 0x14, (int)uVar7 < (int)uVar12 && 0x14 < (int)uVar7)) {
      iVar2 = rand();
      uVar7 = iVar2 % 200 + uVar7;
      if ((int)uVar12 <= (int)uVar7) {
        uVar7 = uVar12;
      }
    }
    uVar7 = uVar7 + 1;
    if (outputNbElement <= (int)uVar7) break;
LAB_0011d0f8:
    lVar4 = (long)(int)(iVar11 + uVar7);
    if (outputIsInteger == 0) {
      if (outputNb != 0xffffffff) {
        dVar15 = __ptr[(long)(int)uVar7 + 1];
        dVar14 = *(double *)(local_48 + lVar4 * 8);
        if ((TA_FuncUnstId)refBufferInt == TA_FUNC_UNST_NONE) {
          if ((dVar15 <= dVar14 + -1e-09) || (dVar14 + 1e-09 <= dVar15)) {
LAB_0011dbcd:
            local_e8 = dVar14;
            local_e0 = dVar15;
            printf("Fail: doRangeTestFixSize diff data for idx=%d (%e,%e)\n",dVar15,(ulong)uVar7);
            printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)local_c4,
                   (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_d0);
            printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f4,
                   (ulong)local_ec);
            if ((local_e0 != 0.0) || (NAN(local_e0))) {
              printf("Fail: Diff %g %%\n",((local_e8 - local_e0) / local_e0) * 100.0);
            }
            free(__ptr);
            EVar6 = TA_TESTUTIL_DRT_DATA_DIFF;
            goto LAB_0011dc68;
          }
        }
        else if ((1e-05 <= dVar15) || (1e-05 <= dVar14)) {
          local_e8 = dVar14;
          local_e0 = dVar15;
          if ((int)outputNb < 100) {
            if (outputNb == 0) {
              uVar12 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
              dVar15 = (double)(uVar12 + uVar7 + 1);
              if ((local_d8 < dVar15) &&
                 (0.5 / (dVar15 - local_d8) <
                  (double)(~-(ulong)(local_e8 < local_e0) &
                           (ulong)((local_e8 - local_e0) / local_e8) |
                          (ulong)((local_e0 - local_e8) / local_e0) & -(ulong)(local_e8 < local_e0))
                 )) {
                printf("\nFail: Value out of tolerance range (%g,%g)\n");
                dVar15 = local_e0;
                dVar14 = local_e8;
                goto LAB_0011dbcd;
              }
            }
            else if (outputNb == 10) {
              local_b8._0_8_ =
                   (double)(~-(ulong)(dVar14 < dVar15) & (ulong)(dVar14 - dVar15) |
                           (ulong)(dVar15 - dVar14) & -(ulong)(dVar14 < dVar15)) * 10.0;
              local_b8._8_8_ = 0;
              uVar12 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
              if ((local_d8 < (double)(uVar12 + uVar7 + 1)) && (1 < (int)(double)local_b8._0_8_)) {
                pcVar10 = "\nFail: Value diffferent by more than 1/10 (%f)\n";
                goto LAB_0011dbb4;
              }
            }
            else {
LAB_0011d557:
              uVar9 = (uint)(long)dVar14;
              uVar3 = (uint)(long)dVar15;
              uVar12 = uVar9 - uVar3;
              if (uVar9 < uVar3) {
                uVar12 = -(uVar9 - uVar3);
              }
              uVar13 = (ulong)uVar12;
              uVar3 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
              uVar3 = uVar3 + uVar7 + 1;
              if (local_d8 < (double)uVar3) {
                if (uVar3 < 100) {
                  if (local_88 <= uVar12) {
                    pcVar10 = "\nFail: Value out of 3*tolerance range (%d,%d)\n";
LAB_0011dcc3:
                    printf(pcVar10,uVar13,(ulong)outputNb);
                    dVar15 = local_e0;
                    dVar14 = local_e8;
                    goto LAB_0011dbcd;
                  }
                }
                else if (uVar3 < 0x96) {
                  if (local_8c <= uVar12) {
                    pcVar10 = "\nFail: Value out of 2*tolerance range (%d,%d)\n";
                    goto LAB_0011dcc3;
                  }
                }
                else if (uVar3 < 200) {
                  if (outputNb <= uVar12) {
                    pcVar10 = "\nFail: Value out of tolerance range (%d,%d)\n";
                    goto LAB_0011dcc3;
                  }
                }
                else if (uVar12 != 0) {
                  pcVar10 = "\nFail: Value not equal (difference is %d)\n";
                  goto LAB_0011dc8b;
                }
              }
            }
          }
          else if (outputNb == 100) {
            local_b8._0_8_ =
                 (double)(~-(ulong)(dVar14 < dVar15) & (ulong)(dVar14 - dVar15) |
                         (ulong)(dVar15 - dVar14) & -(ulong)(dVar14 < dVar15)) * 100.0;
            local_b8._8_8_ = 0;
            uVar12 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
            if ((local_d8 < (double)(uVar7 + 1 + uVar12)) && (1 < (int)(double)local_b8._0_8_)) {
              pcVar10 = "\nFail: Value diffferent by more than 1/100 (%f)\n";
LAB_0011dbb4:
              printf(pcVar10,local_b8._0_8_);
              dVar15 = local_e0;
              dVar14 = local_e8;
              goto LAB_0011dbcd;
            }
          }
          else if (outputNb == 0x168) {
            uVar12 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
            if (local_d8 < (double)(uVar12 + uVar7 + 1)) {
              uVar9 = (uint)(long)local_e8;
              uVar3 = (uint)(long)local_e0;
              uVar12 = uVar9 - uVar3;
              if (uVar9 < uVar3) {
                uVar12 = -(uVar9 - uVar3);
              }
              uVar13 = (ulong)uVar12;
              if ((1 < uVar12) &&
                 (0.1 < (double)(~-(ulong)(local_e8 < local_e0) &
                                 (ulong)((local_e8 - local_e0) / local_e8) |
                                (ulong)((local_e0 - local_e8) / local_e0) &
                                -(ulong)(local_e8 < local_e0)))) {
                pcVar10 = "\nFail: Value diffferent by more than 10 percent over 1 degree (%d)\n";
LAB_0011dc8b:
                printf(pcVar10,uVar13);
                dVar15 = local_e0;
                dVar14 = local_e8;
                goto LAB_0011dbcd;
              }
            }
          }
          else {
            if (outputNb != 1000) goto LAB_0011d557;
            local_b8._0_8_ =
                 (double)(~-(ulong)(dVar14 < dVar15) & (ulong)(dVar14 - dVar15) |
                         (ulong)(dVar15 - dVar14) & -(ulong)(dVar14 < dVar15)) * 1000.0;
            local_b8._8_8_ = 0;
            uVar12 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
            if ((local_d8 < (double)(uVar12 + uVar7 + 1)) && (1 < (int)(double)local_b8._0_8_)) {
              pcVar10 = "\nFail: Value diffferent by more than 1/1000 (%f)\n";
              goto LAB_0011dbb4;
            }
          }
        }
      }
    }
    else if (*(int *)((long)__ptr_00 + (long)(int)uVar7 * 4 + 4) !=
             *(int *)((long)local_38 + lVar4 * 4)) {
      printf("Fail: doRangeTestFixSize diff data for idx=%d (%d,%d)\n",(ulong)uVar7);
      printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)local_c4,
             (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_d0);
      printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f4,
             (ulong)local_ec);
      free(__ptr);
      EVar6 = TA_TESTUTIL_DRT_DATA_DIFF_INT;
      goto LAB_0011dc68;
    }
  }
LAB_0011d608:
  uVar7 = local_c4;
  uVar13 = local_d0;
  if (lookback <= (int)uVar8) {
    lookback = uVar8;
  }
  iVar11 = local_84 - lookback;
  if (local_84 - lookback == 0 || local_84 < lookback) {
    iVar11 = 0;
  }
  if (outputNbElement != (int)local_d0) {
    if ((__ptr[(long)iVar11 + 1] != -2.849284e-199) || (NAN(__ptr[(long)iVar11 + 1]))) {
      printf("Fail: doRangeTestFixSize out-of-bound output (%e)\n");
      printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)uVar7,
             (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,uVar13 & 0xffffffff);
      printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f4,
             (ulong)local_ec);
      free(__ptr);
      EVar6 = TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT;
      goto LAB_0011dc68;
    }
    if (outputNbElement != (int)local_d0) {
      printf("Fail: doRangeTestFixSize out-of-bound output  (%d)\n");
      printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)uVar7,
             (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,uVar13 & 0xffffffff);
      printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f4,
             (ulong)local_ec);
      free(__ptr);
      EVar6 = TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT_INT;
      goto LAB_0011dc68;
    }
  }
  if ((*__ptr != 9.1349043e-200) || (NAN(*__ptr))) {
    printf("Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX (%e)\n");
  }
  else {
    printf("Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX_INT (%d)\n");
  }
  printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)uVar8,(ulong)uVar7,
         (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,uVar13 & 0xffffffff);
  printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_f4,
         (ulong)local_ec);
  free(__ptr);
  EVar6 = TA_TESTUTIL_DRT_BAD_PREFIX;
LAB_0011dc68:
  free(__ptr_00);
  return EVar6;
}

Assistant:

static ErrorNumber doRangeTestFixSize( RangeTestFunction testFunction,
                                       void *opaqueData,
                                       TA_Integer refOutBeg,
                                       TA_Integer refOutNbElement,
                                       TA_Integer refLookback,
                                       const TA_Real *refBuffer,
                                       const TA_Integer *refBufferInt,
                                       TA_FuncUnstId unstId,
                                       TA_Integer fixSize,
                                       unsigned int outputNb,
                                       unsigned int integerTolerance )
{
   TA_RetCode retCode;
   TA_Real *outputBuffer;
   TA_Real val1, val2;
   TA_Integer i, temp;
   TA_Integer outputBegIdx, outputNbElement, lookback;
   TA_Integer startIdx, endIdx, relativeIdx, outputSizeByOptimalLogic;
   TA_Integer *outputBufferInt;
   unsigned int outputIsInteger;

   (void)refLookback;

   /* Allocate the output buffer (+prefix and suffix memory guard). */
   outputBuffer = (TA_Real *)TA_Malloc( (fixSize+2) * sizeof( TA_Real ) );

   if( !outputBuffer )
      return TA_TESTUTIL_DRT_ALLOC_ERR;

   outputBufferInt = (TA_Integer *)TA_Malloc( (fixSize+2) * sizeof( TA_Integer ) );

   if( !refBufferInt )
   {
      TA_Free( outputBuffer );
      return TA_TESTUTIL_DRT_ALLOC_ERR;
   }

   outputBuffer[0] = RESV_PATTERN_PREFIX;
   outputBuffer[fixSize+1] = RESV_PATTERN_SUFFIX;

   outputBufferInt[0] = RESV_PATTERN_PREFIX_INT;
   outputBufferInt[fixSize+1] = RESV_PATTERN_SUFFIX_INT;

   /* Initialize the outputs with improbable values. */
   for( i=1; i <= fixSize; i++ )
   {
      outputBuffer[i] = RESV_PATTERN_IMPROBABLE;
      outputBufferInt[i] = RESV_PATTERN_IMPROBABLE_INT;
   }

   /* Test for a large number of possible startIdx */
   for( startIdx=0; startIdx <= (MAX_RANGE_SIZE-fixSize); startIdx++ )
   {
      /* Call the TA function. */
      endIdx = startIdx+fixSize-1;
      retCode = CallTestFunction( testFunction, startIdx, endIdx,
                              &outputBuffer[1], &outputBufferInt[1],
                              &outputBegIdx, &outputNbElement, &lookback,
                              opaqueData, outputNb, &outputIsInteger );

      if( retCode != TA_SUCCESS )
      {
          /* No call shall never fail here. When the range
           * is "out-of-range" the function shall still return
           * TA_SUCCESS with the outNbElement equal to zero.
           */
         printf( "Fail: doRangeTestFixSize testFunction return error=(%d) (%d,%d)\n", retCode, fixSize, startIdx );
         TA_Free( outputBuffer );
         TA_Free( outputBufferInt );
         return TA_TESTUTIL_DRT_RETCODE_ERR;
      }
      else
      {
         /* Possible startIdx gap of the output shall be always the
          * same regardless of the range.
          */
         if( outputNbElement == 0 )
         {
            /* Trap cases where there is no output. */
            if( (startIdx > lookback) || (endIdx > lookback) )
            {
               /* Whenever startIdx is greater than lookback, some data
                * shall be return. Same idea with endIdx.
                *
                * Note:
                *  some output will never start at the startIdx, particularly
                *  when a TA function have multiple output. Usually, the first output
                *  will be between startIdx/endIdx and other outputs may have a "gap"
                *  from the startIdx.
                *
                * Example:
                *    Stochastic %K is between startIdx/endIdx, but %D output will
                *    have less data because it is a MA of %K. A gap will then
                *    exist for the %D output.
                */
               printf( "Fail: doRangeTestFixSize data missing (%d,%d,%d)\n", startIdx, endIdx, lookback );

               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_MISSING_DATA;
            }
         }
         else
         {
            /* Some output was returned. Are the returned index correct? */
            if( (outputBegIdx < startIdx) || (outputBegIdx > endIdx) || (outputBegIdx < refOutBeg))
            {
               printf( "Fail: doRangeTestFixSize bad outBegIdx\n" );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_OUTBEGIDX;
            }

            if( (outputNbElement > fixSize) || (outputNbElement > refOutNbElement) )
            {
               printf( "Fail: doRangeTestFixSize Incorrect outputNbElement\n" );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free(  outputBuffer );
               return TA_TESTUTIL_DRT_BAD_OUTNBLEMENT;
            }

            /* Is the calculated lookback too high? */
            if( outputBegIdx < lookback )
            {
               printf( "Fail: doRangeTestFixSize Lookback calculation too high? (%d)\n", lookback );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_LOOKBACK_TOO_HIGH;
            }

            /* Is the output identical to the reference? */
            relativeIdx = outputBegIdx-refOutBeg;
            for( i=0; i < outputNbElement; i++ )
            {
               if( outputIsInteger )
               {
                  if( outputBufferInt[1+i] != refBufferInt[relativeIdx+i] )
                  {
                     printf( "Fail: doRangeTestFixSize diff data for idx=%d (%d,%d)\n", i,
                              outputBufferInt[1+i], refBufferInt[relativeIdx+i] );
                     printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
                     printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
                     TA_Free( outputBuffer );
                     TA_Free( outputBufferInt );
                     return TA_TESTUTIL_DRT_DATA_DIFF_INT;
                  }
               }
               else
               {
                  val1 = outputBuffer[1+i];
                  val2 = refBuffer[relativeIdx+i];
                  if( !dataWithinReasonableRange( val1, val2, i, unstId, integerTolerance ) )
                  {
                     printf( "Fail: doRangeTestFixSize diff data for idx=%d (%e,%e)\n", i, val1, val2 );
                     printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
                     printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
                     if( val1 != 0.0 )
                        printf( "Fail: Diff %g %%\n", ((val2-val1)/val1)*100.0 );
                     TA_Free( outputBuffer );
                     TA_Free( outputBufferInt );
                     return TA_TESTUTIL_DRT_DATA_DIFF;
                  }
               }

               /* Randomly skip the verification of some value. Limit
                * cases are always checked though.
                */
               if( outputNbElement > 30 )
               {
                  temp = outputNbElement-20;
                  if( (i > 20) && (i < temp) )
                  {
                     /* Randomly skips from 0 to 200 verification.
                      * Never make it skip the last 20 values.
                      */
                     i += (rand() % 200);
                     if( i > temp )
                        i = temp;
                  }
               }
            }

            /* Verify out-of-bound writing in the output buffer. */
            outputSizeByOptimalLogic = max(lookback,startIdx);
            if( outputSizeByOptimalLogic > endIdx )
               outputSizeByOptimalLogic = 0;
            else
               outputSizeByOptimalLogic = endIdx-outputSizeByOptimalLogic+1;

            if( (fixSize != outputNbElement) && (outputBuffer[1+outputSizeByOptimalLogic] != RESV_PATTERN_IMPROBABLE) )
            {
               printf( "Fail: doRangeTestFixSize out-of-bound output (%e)\n", outputBuffer[1+outputSizeByOptimalLogic] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT;
            }

            if( (fixSize != outputNbElement) && (outputBufferInt[1+outputSizeByOptimalLogic] != RESV_PATTERN_IMPROBABLE_INT) )
            {
               printf( "Fail: doRangeTestFixSize out-of-bound output  (%d)\n", outputBufferInt[1+outputSizeByOptimalLogic] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT_INT;
            }

            /* Verify that the memory guard were preserved. */
            if( outputBuffer[0] != RESV_PATTERN_PREFIX )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX (%e)\n", outputBuffer[0] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_PREFIX;
            }

            if( outputBufferInt[0] != RESV_PATTERN_PREFIX_INT )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX_INT (%d)\n", outputBufferInt[0] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_PREFIX;
            }

            if( outputBuffer[fixSize+1] != RESV_PATTERN_SUFFIX )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_SUFFIX (%e)\n", outputBuffer[fixSize+1] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_SUFFIX;
            }

            if( outputBufferInt[fixSize+1] != RESV_PATTERN_SUFFIX_INT )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_SUFFIX_INT (%d)\n", outputBufferInt[fixSize+1] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_SUFFIX;
            }

            /* Clean-up for next test. */
            if( outputIsInteger )
            {
               for( i=1; i <= fixSize; i++ )
                  outputBufferInt[i] = RESV_PATTERN_IMPROBABLE_INT;
            }
            else
            {
               for( i=1; i <= fixSize; i++ )
                  outputBuffer[i] = RESV_PATTERN_IMPROBABLE;
            }
         }

         /* Skip some startIdx at random. Limit case are still
          * tested though.
          */
         if( (startIdx > 30) && ((startIdx+100) <= (MAX_RANGE_SIZE-fixSize)) )
         {
            /* Randomly skips from 40 to 100 tests. */
            temp = (rand() % 100)+40;
            startIdx += temp;
         }
      }

      /* Loop and move forward for the next startIdx to test. */
   }

   TA_Free( outputBuffer );
   TA_Free( outputBufferInt );
   return TA_TEST_PASS;
}